

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

void do_tame(CHAR_DATA *ch,char *argument)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  CHAR_DATA *ch_00;
  int iVar4;
  char *txt;
  char arg [4608];
  
  iVar3 = get_skill(ch,(int)gsn_tame);
  one_argument(argument,arg);
  if (arg[0] == '\0') {
    ch_00 = ch->fighting;
  }
  else {
    ch_00 = get_char_room(ch,arg);
  }
  if (ch_00 == (CHAR_DATA *)0x0) {
    txt = "They aren\'t here to tame though.\n\r";
  }
  else {
    bVar2 = is_npc(ch_00);
    if (bVar2) {
      if (((ch_00->act[0] & 0x20) != 0) || ((ch_00->off_flags[0] & 0x800000) != 0)) {
        iVar3 = ((int)ch->level - (int)ch_00->level) * 3 + iVar3;
        iVar4 = 0x5a;
        if (iVar3 < 0x5a) {
          iVar4 = iVar3;
        }
        WAIT_STATE(ch,0xc);
        iVar3 = number_percent();
        if (iVar4 < iVar3) {
          act("$n tries to calm down $N but fails.",ch,(void *)0x0,ch_00,1);
          act("$n tries to calm you down but fails.",ch,(void *)0x0,ch_00,2);
          act("You try to calm $N down but fail.",ch,(void *)0x0,ch_00,3);
          check_improve(ch,(int)gsn_tame,false,2);
          return;
        }
        act("$n calms $N down.",ch,(void *)0x0,ch_00,1);
        act("You calm $N down.",ch,(void *)0x0,ch_00,3);
        act("$n calms you down.",ch,(void *)0x0,ch_00,2);
        check_improve(ch,(int)gsn_tame,true,2);
        stop_fighting(ch_00,true);
        ch_00->last_fought = (CHAR_DATA *)0x0;
        *(byte *)ch_00->act = (byte)ch_00->act[0] & 0xdf;
        pbVar1 = (byte *)((long)ch_00->off_flags + 2);
        *pbVar1 = *pbVar1 & 0x7f;
        return;
      }
      txt = "They are as tame as they can be.\n\r";
    }
    else {
      txt = "Why not just talk to them about your problems?\n\r";
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_tame(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	char arg[MAX_INPUT_LENGTH];
	int chance;

	chance = get_skill(ch, gsn_tame);
	one_argument(argument, arg);

	if (arg[0] == '\0')
		victim = ch->fighting;
	else
		victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here to tame though.\n\r", ch);
		return;
	}

	if (!is_npc(victim))
	{
		send_to_char("Why not just talk to them about your problems?\n\r", ch);
		return;
	}
	else if (!IS_SET(victim->act, ACT_AGGRESSIVE) && !IS_SET(victim->off_flags, SPAM_MURDER))
	{
		send_to_char("They are as tame as they can be.\n\r", ch);
		return;
	}

	chance += (ch->level - victim->level) * 3;

	if (chance > 90)
		chance = 90;

	WAIT_STATE(ch, 12);

	if (number_percent() > chance)
	{
		act("$n tries to calm down $N but fails.", ch, 0, victim, TO_NOTVICT);
		act("$n tries to calm you down but fails.", ch, 0, victim, TO_VICT);
		act("You try to calm $N down but fail.", ch, 0, victim, TO_CHAR);
		check_improve(ch, gsn_tame, false, 2);
		return;
	}

	act("$n calms $N down.", ch, 0, victim, TO_NOTVICT);
	act("You calm $N down.", ch, 0, victim, TO_CHAR);
	act("$n calms you down.", ch, 0, victim, TO_VICT);

	check_improve(ch, gsn_tame, true, 2);
	stop_fighting(victim, true);
	victim->last_fought = nullptr;

	REMOVE_BIT(victim->act, ACT_AGGRESSIVE);
	REMOVE_BIT(victim->off_flags, SPAM_MURDER);
}